

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogToFile(int auto_open_depth,char *filename)

{
  ImGuiContext_conflict *pIVar1;
  ImFileHandle pFVar2;
  ImFileHandle f;
  ImGuiContext_conflict *g;
  char *filename_local;
  int auto_open_depth_local;
  
  pIVar1 = GImGui;
  if ((GImGui->LogEnabled & 1U) == 0) {
    g = (ImGuiContext_conflict *)filename;
    if (filename == (char *)0x0) {
      g = (ImGuiContext_conflict *)(GImGui->IO).LogFilename;
    }
    if ((g != (ImGuiContext_conflict *)0x0) && (g->Initialized != false)) {
      pFVar2 = ImFileOpen(&g->Initialized,"ab");
      if (pFVar2 == (ImFileHandle)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                      ,0x2bd7,"void ImGui::LogToFile(int, const char *)");
      }
      LogBegin(ImGuiLogType_File,auto_open_depth);
      pIVar1->LogFile = pFVar2;
    }
  }
  return;
}

Assistant:

void ImGui::LogToFile(int auto_open_depth, const char* filename)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;

    // FIXME: We could probably open the file in text mode "at", however note that clipboard/buffer logging will still
    // be subject to outputting OS-incompatible carriage return if within strings the user doesn't use IM_NEWLINE.
    // By opening the file in binary mode "ab" we have consistent output everywhere.
    if (!filename)
        filename = g.IO.LogFilename;
    if (!filename || !filename[0])
        return;
    ImFileHandle f = ImFileOpen(filename, "ab");
    if (!f)
    {
        IM_ASSERT(0);
        return;
    }

    LogBegin(ImGuiLogType_File, auto_open_depth);
    g.LogFile = f;
}